

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_stages
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,Value *stages,
          VkPipelineShaderStageCreateInfo **out_info)

{
  DatabaseInterface *pDVar1;
  StateCreatorInterface *pSVar2;
  bool bVar3;
  SizeType SVar4;
  uint uVar5;
  VkShaderStageFlagBits VVar6;
  int iVar7;
  VkPipelineShaderStageCreateInfo *pVVar8;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar9;
  Type pGVar10;
  Ch *pCVar11;
  char *pcVar12;
  VkShaderModule pVVar13;
  _Node_iterator_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false> _Var14;
  VkSpecializationInfo **out_info_00;
  allocator_type local_91;
  uint64_t module;
  Impl *local_88;
  DatabaseInterface *local_80;
  StateCreatorInterface *local_78;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_70;
  size_t external_state_size;
  VkPipelineShaderStageCreateInfo *local_60;
  VkPipelineShaderStageCreateInfo **local_58;
  Value *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> external_state;
  
  local_80 = resolver;
  local_58 = out_info;
  SVar4 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(stages);
  pVVar8 = ScratchAllocator::allocate_n_cleared<VkPipelineShaderStageCreateInfo>
                     (&this->allocator,(ulong)SVar4);
  local_50 = stages;
  this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             *)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::Begin(stages);
  local_70 = &(this->replayed_shader_modules)._M_h;
  out_info_00 = &pVVar8->pSpecializationInfo;
  local_88 = this;
  local_78 = iface;
  local_60 = pVVar8;
  do {
    pGVar9 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::End(local_50);
    if (this_00 == pGVar9) {
      *local_58 = local_60;
LAB_0011500b:
      return this_00 == pGVar9;
    }
    ((VkPipelineShaderStageCreateInfo *)(out_info_00 + -5))->sType =
         VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
    pGVar10 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"flags");
    uVar5 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar10);
    *(uint *)(out_info_00 + -3) = uVar5;
    pGVar10 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"stage");
    VVar6 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(pGVar10);
    *(VkShaderStageFlagBits *)((long)out_info_00 + -0x14) = VVar6;
    pGVar10 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"name");
    pCVar11 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetString(pGVar10);
    pGVar10 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"name");
    SVar4 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetStringLength(pGVar10);
    pcVar12 = duplicate_string(local_88,pCVar11,(ulong)SVar4);
    out_info_00[-1] = (VkSpecializationInfo *)pcVar12;
    bVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)this_00,"specializationInfo");
    if (bVar3) {
      pGVar10 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>(this_00,"specializationInfo");
      parse_specialization_info(local_88,pGVar10,out_info_00);
    }
    bVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)this_00,"pNext");
    if (bVar3) {
      pGVar10 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                ::operator[]<char_const>(this_00,"pNext");
      bVar3 = parse_pnext_chain(local_88,pGVar10,out_info_00 + -4,(StateCreatorInterface *)0x0,
                                (DatabaseInterface *)0x0,(Value *)0x0);
      if (!bVar3) goto LAB_0011500b;
    }
    pGVar10 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>(this_00,"module");
    pCVar11 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetString(pGVar10);
    pVVar13 = (VkShaderModule)string_to_uint64(pCVar11);
    module = (uint64_t)pVVar13;
    if ((pVVar13 != (VkShaderModule)0x0) && (local_88->resolve_shader_modules == true)) {
      _Var14._M_cur =
           (__node_type *)
           std::
           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(local_70,&module);
      if (_Var14._M_cur == (__node_type *)0x0) {
        external_state_size = 0;
        if (local_80 != (DatabaseInterface *)0x0) {
          iVar7 = (*local_80->_vptr_DatabaseInterface[3])(local_80,4,module,&external_state_size,0);
          pDVar1 = local_80;
          if ((char)iVar7 != '\0') {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&external_state,external_state_size,&local_91);
            iVar7 = (*pDVar1->_vptr_DatabaseInterface[3])
                              (pDVar1,4,module,&external_state_size,
                               external_state.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            pSVar2 = local_78;
            if ((char)iVar7 == '\0') {
LAB_00114ff0:
              log_missing_resource("Shader module",module);
            }
            else {
              bVar3 = parse(local_88,local_78,local_80,
                            external_state.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)external_state.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)external_state.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
              if (bVar3) {
                (**(code **)(*(long *)pSVar2 + 0x78))(pSVar2);
                _Var14._M_cur =
                     (__node_type *)
                     std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_VkShaderModule_T_*>,_std::allocator<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(local_70,&module);
                if (_Var14._M_cur != (__node_type *)0x0) {
                  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                            (&external_state.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
                  goto LAB_00114fb8;
                }
                goto LAB_00114ff0;
              }
            }
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&external_state.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            goto LAB_0011500b;
          }
        }
        log_missing_resource("Shader module",module);
        goto LAB_0011500b;
      }
      (**(code **)(*(long *)local_78 + 0x78))();
LAB_00114fb8:
      pVVar13 = *(VkShaderModule *)
                 ((long)&((_Var14._M_cur)->
                         super__Hash_node_value<std::pair<const_unsigned_long,_VkShaderModule_T_*>,_false>
                         ).
                         super__Hash_node_value_base<std::pair<const_unsigned_long,_VkShaderModule_T_*>_>
                         ._M_storage._M_storage + 8);
    }
    out_info_00[-2] = (VkSpecializationInfo *)pVVar13;
    this_00 = this_00 + 0x10;
    out_info_00 = out_info_00 + 6;
  } while( true );
}

Assistant:

bool StateReplayer::Impl::parse_stages(StateCreatorInterface &iface, DatabaseInterface *resolver, const Value &stages,
                                       const VkPipelineShaderStageCreateInfo **out_info)
{
	auto *state = allocator.allocate_n_cleared<VkPipelineShaderStageCreateInfo>(stages.Size());
	auto *ret = state;

	for (auto itr = stages.Begin(); itr != stages.End(); ++itr, state++)
	{
		auto &obj = *itr;
		state->sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
		state->flags = obj["flags"].GetUint();
		state->stage = static_cast<VkShaderStageFlagBits>(obj["stage"].GetUint());
		state->pName = duplicate_string(obj["name"].GetString(), obj["name"].GetStringLength());
		if (obj.HasMember("specializationInfo"))
			if (!parse_specialization_info(obj["specializationInfo"], &state->pSpecializationInfo))
				return false;

		if (obj.HasMember("pNext"))
			if (!parse_pnext_chain(obj["pNext"], &state->pNext))
				return false;

		auto module = string_to_uint64(obj["module"].GetString());
		if (module > 0 && resolve_shader_modules)
		{
			auto module_iter = replayed_shader_modules.find(module);
			if (module_iter == replayed_shader_modules.end())
			{
				size_t external_state_size = 0;
				if (!resolver || !resolver->read_entry(RESOURCE_SHADER_MODULE, module, &external_state_size, nullptr,
				                                       PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Shader module", module);
					return false;
				}

				vector<uint8_t> external_state(external_state_size);

				if (!resolver->read_entry(RESOURCE_SHADER_MODULE, module, &external_state_size, external_state.data(),
				                          PAYLOAD_READ_NO_FLAGS))
				{
					log_missing_resource("Shader module", module);
					return false;
				}

				if (!this->parse(iface, resolver, external_state.data(), external_state.size()))
					return false;

				iface.sync_shader_modules();
				module_iter = replayed_shader_modules.find(module);
				if (module_iter == replayed_shader_modules.end())
				{
					log_missing_resource("Shader module", module);
					return false;
				}
			}
			else
				iface.sync_shader_modules();

			state->module = module_iter->second;
		}
		else
			state->module = api_object_cast<VkShaderModule>(module);
	}

	*out_info = ret;
	return true;
}